

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

pair<example::spread_t,_boost::asio::const_buffer> *
read<example::spread_t>
          (pair<example::spread_t,_boost::asio::const_buffer> *__return_storage_ptr__,const_buffer b
          )

{
  spread_t res;
  reader r;
  spread_t sStack_78;
  reader local_38;
  
  local_38.buf_.size_ = b.size_;
  local_38.buf_.data_ = b.data_;
  local_38.opts_.super_type.m_initialized = false;
  example::spread_t::spread_t(&sStack_78);
  detail::reader::operator()(&local_38,&sStack_78);
  example::spread_t::spread_t(&__return_storage_ptr__->first,&sStack_78);
  (__return_storage_ptr__->second).data_ = local_38.buf_.data_;
  (__return_storage_ptr__->second).size_ = local_38.buf_.size_;
  boost::optional_detail::
  optional_base<std::vector<example::option_t,_std::allocator<example::option_t>_>_>::~optional_base
            (&sStack_78.legs.val_.super_type);
  return __return_storage_ptr__;
}

Assistant:

std::pair<T, asio::const_buffer> read(asio::const_buffer b) {
    detail::reader r(std::move(b));
    T res;
    r(res);
    return std::make_pair(res, r.buf_);
}